

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O3

void __thiscall
FGLInterface::Precache
          (FGLInterface *this,BYTE *texhitlist,
          TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *actorhitlist)

{
  byte bVar1;
  FTexture *pFVar2;
  PClassActor *ti;
  FModel *pFVar3;
  FModelVertexBuffer *pFVar4;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *this_00;
  bool bVar5;
  Node *pNVar6;
  ulong uVar7;
  FModel **ppFVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  hash_t hVar12;
  ulong *puVar13;
  void *__s;
  void *__s_00;
  FSpriteModelFrame *pFVar14;
  FMaterial *pFVar15;
  IPair *pIVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *pTVar20;
  int i_1;
  ulong uVar21;
  long lVar22;
  double dVar23;
  PrecacheProgress precacheProgress;
  timespec ts;
  undefined1 local_5c [8];
  bool local_54;
  TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *local_50;
  ulong *local_48;
  timespec local_40;
  
  uVar18 = (ulong)sprites.Count;
  puVar13 = (ulong *)operator_new__(uVar18 * 0x18 + 8);
  *puVar13 = uVar18;
  if (uVar18 != 0) {
    lVar22 = 0;
    do {
      *(undefined4 *)((long)puVar13 + lVar22 + 0x1c) = 0;
      TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::SetNodeVector
                ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)
                 ((long)puVar13 + lVar22 + 8),1);
      lVar22 = lVar22 + 0x18;
    } while (uVar18 * 0x18 != lVar22);
  }
  uVar21 = (ulong)(int)TexMan.Textures.Count;
  uVar18 = 0xffffffffffffffff;
  if (-1 < (long)uVar21) {
    uVar18 = uVar21 * 8;
  }
  local_50 = actorhitlist;
  local_48 = puVar13;
  __s = operator_new__(uVar18);
  uVar18 = (ulong)Models.super_TArray<FModel_*,_FModel_*>.Count;
  __s_00 = operator_new__(uVar18);
  memset(__s_00,0,uVar18);
  memset(__s,0,uVar21 * 8);
  if (0 < (long)uVar21) {
    lVar22 = 0;
    do {
      if (((texhitlist[lVar22] & 5) != 0) &&
         (pFVar2 = TexMan.Textures.Array[lVar22].Texture, ((pFVar2->gl_info).field_0x4c & 0x10) != 0
         )) {
        lVar17 = 0;
        do {
          pFVar15 = pFVar2[1].gl_info.Material[lVar17 + -9];
          if (pFVar15 != (FMaterial *)0x0) {
            iVar11._0_2_ = pFVar15->mRenderWidth;
            iVar11._2_2_ = pFVar15->mRenderHeight;
            texhitlist[iVar11] = texhitlist[iVar11] | 2;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != 6);
        uVar21 = (ulong)TexMan.Textures.Count;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < (int)uVar21);
  }
  uVar10 = local_50->Size;
  if (uVar10 != 0) {
    uVar18 = 0;
    do {
      uVar18 = uVar18 & 0xffffffff;
      pNVar6 = local_50->Nodes + uVar18;
      while (pIVar16 = &pNVar6->Pair, *(long *)((long)(pIVar16 + -1) + 8) == 1) {
        uVar18 = uVar18 + 1;
        pNVar6 = (Node *)(pIVar16 + 1);
        if (uVar10 <= uVar18) goto LAB_0047686e;
      }
      ti = pIVar16->Key;
      iVar11 = GLTranslationPalette::GetInternalTranslation
                         (*(int *)((ti->super_PClass).Defaults + 0x380));
      if (0 < ti->NumOwnedStates) {
        lVar22 = 0;
        do {
          local_40.tv_sec._0_1_ = 1;
          TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::Insert
                    ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)
                     (puVar13 + (ulong)ti->OwnedStates[lVar22].sprite * 3 + 1),iVar11,
                     (bool *)&local_40);
          pFVar14 = gl_FindModelFrame(&ti->super_PClass,(uint)ti->OwnedStates[lVar22].sprite,
                                      (uint)ti->OwnedStates[lVar22].Frame,false);
          if (pFVar14 != (FSpriteModelFrame *)0x0) {
            lVar17 = 0;
            do {
              ppFVar8 = Models.super_TArray<FModel_*,_FModel_*>.Array;
              lVar19 = (long)pFVar14->skinIDs[lVar17].texnum;
              if (lVar19 < 1) {
                if ((long)pFVar14->modelIDs[lVar17] != -1) {
                  pFVar3 = Models.super_TArray<FModel_*,_FModel_*>.Array[pFVar14->modelIDs[lVar17]];
                  pFVar3->curSpriteMDLFrame = pFVar14;
                  pFVar3->curMDLIndex = (int)lVar17;
                  (*ppFVar8[pFVar14->modelIDs[lVar17]]->_vptr_FModel[6])();
                }
              }
              else {
                texhitlist[lVar19] = texhitlist[lVar19] | 2;
              }
              if ((long)pFVar14->modelIDs[lVar17] != -1) {
                *(undefined1 *)((long)__s_00 + (long)pFVar14->modelIDs[lVar17]) = 1;
              }
              lVar17 = lVar17 + 1;
            } while (lVar17 != 4);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < ti->NumOwnedStates);
      }
      uVar18 = uVar18 + 1;
      uVar10 = local_50->Size;
    } while ((uint)uVar18 < uVar10);
  }
LAB_0047686e:
  if (-1 < (int)(sprites.Count - 1)) {
    uVar18 = (ulong)(sprites.Count - 1);
    do {
      hVar12 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CountUsed
                         ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)
                          (puVar13 + uVar18 * 3 + 1));
      if ((hVar12 != 0) && (bVar1 = sprites.Array[uVar18].numframes, (ulong)bVar1 != 0)) {
        lVar22 = (long)&(SpriteFrames.Array)->Texture[0].texnum +
                 (ulong)((uint)sprites.Array[uVar18].spriteframes * 0x50);
        uVar21 = 0;
        do {
          lVar17 = 0;
          do {
            lVar19 = (long)*(int *)(lVar22 + lVar17 * 4);
            if (0 < lVar19) {
              *(TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> **)((long)__s + lVar19 * 8) =
                   (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)
                   (puVar13 + uVar18 * 3 + 1);
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 != 0x10);
          uVar21 = uVar21 + 1;
          lVar22 = lVar22 + 0x50;
        } while (uVar21 != bVar1);
      }
      bVar5 = 0 < (long)uVar18;
      uVar18 = uVar18 - 1;
    } while (bVar5);
  }
  if (Models.super_TArray<FModel_*,_FModel_*>.Count != 0) {
    uVar18 = 0;
    uVar10 = Models.super_TArray<FModel_*,_FModel_*>.Count;
    do {
      if (*(char *)((long)__s_00 + uVar18) == '\0') {
        pFVar3 = Models.super_TArray<FModel_*,_FModel_*>.Array[uVar18];
        pFVar4 = pFVar3->mVBuf;
        if (pFVar4 != (FModelVertexBuffer *)0x0) {
          (*(pFVar4->super_FVertexBuffer)._vptr_FVertexBuffer[1])();
          uVar10 = Models.super_TArray<FModel_*,_FModel_*>.Count;
        }
        pFVar3->mVBuf = (FModelVertexBuffer *)0x0;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < uVar10);
  }
  uVar9 = TexMan.Textures.Count;
  uVar10 = TexMan.Textures.Count - 1;
  if (0 < (int)TexMan.Textures.Count) {
    lVar22 = (ulong)uVar10 << 4;
    uVar18 = (ulong)uVar10;
    do {
      if ((uVar18 < TexMan.Textures.Count) &&
         (lVar17 = *(long *)((long)&(TexMan.Textures.Array)->Texture + lVar22), lVar17 != 0)) {
        if ((texhitlist[uVar18] == '\0') && (*(undefined8 **)(lVar17 + 0x48) != (undefined8 *)0x0))
        {
          FGLTexture::Clean((FGLTexture *)**(undefined8 **)(lVar17 + 0x48),true);
        }
        pTVar20 = *(TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> **)
                   ((long)__s + uVar18 * 8);
        if (((pTVar20 == (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)0x0) ||
            (hVar12 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CountUsed(pTVar20),
            hVar12 == 0)) && (*(undefined8 **)(lVar17 + 0x50) != (undefined8 *)0x0)) {
          FGLTexture::Clean((FGLTexture *)**(undefined8 **)(lVar17 + 0x50),true);
        }
      }
      lVar22 = lVar22 + -0x10;
      bVar5 = 0 < (long)uVar18;
      uVar18 = uVar18 - 1;
    } while (bVar5);
  }
  if (gl_precache.Value != false) {
    local_5c._0_4_ = I_FPSTime();
    local_5c._4_4_ = CR_YELLOW;
    local_54 = false;
    pTVar20 = (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)0x1;
    clock_gettime(1,&local_40);
    lVar22 = CONCAT71(local_40.tv_sec._1_7_,(undefined1)local_40.tv_sec);
    dVar23 = (double)local_40.tv_nsec;
    if (0 < (int)uVar9) {
      lVar17 = (ulong)uVar10 << 4;
      uVar18 = (ulong)uVar10;
      do {
        if ((uVar18 < TexMan.Textures.Count) &&
           (pFVar2 = *(FTexture **)((long)&(TexMan.Textures.Array)->Texture + lVar17),
           pFVar2 != (FTexture *)0x0)) {
          PrecacheTexture((FGLInterface *)pTVar20,pFVar2,(uint)texhitlist[uVar18]);
          this_00 = *(TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> **)
                     ((long)__s + uVar18 * 8);
          if ((this_00 != (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)0x0) &&
             (pTVar20 = this_00,
             hVar12 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CountUsed(this_00),
             hVar12 != 0)) {
            pFVar15 = FMaterial::ValidateTexture(pFVar2,true);
            if (pFVar15 != (FMaterial *)0x0) {
              FMaterial::PrecacheList(pFVar15,this_00);
            }
            pTVar20 = (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)local_5c;
            anon_unknown.dwarf_354460::PrecacheProgress::Update((PrecacheProgress *)pTVar20);
          }
        }
        lVar17 = lVar17 + -0x10;
        bVar5 = 0 < (long)uVar18;
        uVar18 = uVar18 - 1;
      } while (bVar5);
    }
    if (Models.super_TArray<FModel_*,_FModel_*>.Count != 0) {
      uVar18 = 0;
      uVar10 = Models.super_TArray<FModel_*,_FModel_*>.Count;
      do {
        if (*(char *)((long)__s_00 + uVar18) != '\0') {
          (*Models.super_TArray<FModel_*,_FModel_*>.Array[uVar18]->_vptr_FModel[5])();
          anon_unknown.dwarf_354460::PrecacheProgress::Update((PrecacheProgress *)local_5c);
          uVar10 = Models.super_TArray<FModel_*,_FModel_*>.Count;
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < uVar10);
    }
    clock_gettime(1,&local_40);
    DPrintf(3,"\x1cGTextures were precached in %.03f ms\n",
            (((double)local_40.tv_nsec - dVar23) * 1e-09 +
            ((double)CONCAT71(local_40.tv_sec._1_7_,(undefined1)local_40.tv_sec) - (double)lVar22))
            * 1000.0);
  }
  operator_delete__(__s);
  puVar13 = local_48;
  uVar18 = *local_48 * 0x18;
  uVar21 = uVar18;
  uVar7 = *local_48;
  while (uVar7 != 0) {
    TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::~TMap
              ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)
               ((long)puVar13 + (uVar21 - 0x10)));
    uVar21 = uVar21 - 0x18;
    uVar7 = uVar21;
  }
  operator_delete__(puVar13,uVar18 + 8);
  operator_delete__(__s_00);
  return;
}

Assistant:

void FGLInterface::Precache(BYTE *texhitlist, TMap<PClassActor*, bool> &actorhitlist)
{
	SpriteHits *spritelist = new SpriteHits[sprites.Size()];
	SpriteHits **spritehitlist = new SpriteHits*[TexMan.NumTextures()];
	TMap<PClassActor*, bool>::Iterator it(actorhitlist);
	TMap<PClassActor*, bool>::Pair *pair;
	BYTE *modellist = new BYTE[Models.Size()];
	memset(modellist, 0, Models.Size());
	memset(spritehitlist, 0, sizeof(SpriteHits**) * TexMan.NumTextures());

	// this isn't done by the main code so it needs to be done here first:
	// check skybox textures and mark the separate faces as used
	for (int i = 0; i<TexMan.NumTextures(); i++)
	{
		// HIT_Wall must be checked for MBF-style sky transfers. 
		if (texhitlist[i] & (FTextureManager::HIT_Sky | FTextureManager::HIT_Wall))
		{
			FTexture *tex = TexMan.ByIndex(i);
			if (tex->gl_info.bSkybox)
			{
				FSkyBox *sb = static_cast<FSkyBox*>(tex);
				for (int i = 0; i<6; i++)
				{
					if (sb->faces[i])
					{
						int index = sb->faces[i]->id.GetIndex();
						texhitlist[index] |= FTextureManager::HIT_Flat;
					}
				}
			}
		}
	}

	// Check all used actors.
	// 1. mark all sprites associated with its states
	// 2. mark all model data and skins associated with its states
	while (it.NextPair(pair))
	{
		PClassActor *cls = pair->Key;
		int gltrans = GLTranslationPalette::GetInternalTranslation(GetDefaultByType(cls)->Translation);

		for (int i = 0; i < cls->NumOwnedStates; i++)
		{
			spritelist[cls->OwnedStates[i].sprite].Insert(gltrans, true);
			FSpriteModelFrame * smf = gl_FindModelFrame(cls, cls->OwnedStates[i].sprite, cls->OwnedStates[i].Frame, false);
			if (smf != NULL)
			{
				for (int i = 0; i < MAX_MODELS_PER_FRAME; i++)
				{
					if (smf->skinIDs[i].isValid())
					{
						texhitlist[smf->skinIDs[i].GetIndex()] |= FTexture::TEX_Flat;
					}
					else if (smf->modelIDs[i] != -1)
					{
						Models[smf->modelIDs[i]]->PushSpriteMDLFrame(smf, i);
						Models[smf->modelIDs[i]]->AddSkins(texhitlist);
					}
					if (smf->modelIDs[i] != -1)
					{
						modellist[smf->modelIDs[i]] = 1;
					}
				}
			}
		}
	}

	// mark all sprite textures belonging to the marked sprites.
	for (int i = (int)(sprites.Size() - 1); i >= 0; i--)
	{
		if (spritelist[i].CountUsed())
		{
			int j, k;
			for (j = 0; j < sprites[i].numframes; j++)
			{
				const spriteframe_t *frame = &SpriteFrames[sprites[i].spriteframes + j];

				for (k = 0; k < 16; k++)
				{
					FTextureID pic = frame->Texture[k];
					if (pic.isValid())
					{
						spritehitlist[pic.GetIndex()] = &spritelist[i];
					}
				}
			}
		}
	}

	// delete everything unused before creating any new resources to avoid memory usage peaks.

	// delete unused models
	for (unsigned i = 0; i < Models.Size(); i++)
	{
		if (!modellist[i]) Models[i]->DestroyVertexBuffer();
	}

	// delete unused textures
	int cnt = TexMan.NumTextures();
	for (int i = cnt - 1; i >= 0; i--)
	{
		FTexture *tex = TexMan.ByIndex(i);
		if (tex != nullptr)
		{
			if (!texhitlist[i])
			{
				if (tex->gl_info.Material[0]) tex->gl_info.Material[0]->Clean(true);
			}
			if (spritehitlist[i] == nullptr || (*spritehitlist[i]).CountUsed() == 0)
			{
				if (tex->gl_info.Material[1]) tex->gl_info.Material[1]->Clean(true);
			}
		}
	}

	if (gl_precache)
	{
		PrecacheProgress precacheProgress;

		// Consider to comment out PrecacheProgress::Update() call below
		// in order to get more precise timing results
		cycle_t precacheProfiler;
		precacheProfiler.Reset();
		precacheProfiler.Clock();

		// cache all used textures
		for (int i = cnt - 1; i >= 0; i--)
		{
			FTexture *tex = TexMan.ByIndex(i);
			if (tex != nullptr)
			{
				PrecacheTexture(tex, texhitlist[i]);
				if (spritehitlist[i] != nullptr && (*spritehitlist[i]).CountUsed() > 0)
				{
					PrecacheSprite(tex, *spritehitlist[i]);
					precacheProgress.Update();
				}
			}
		}

		// cache all used models
		for (unsigned i = 0; i < Models.Size(); i++)
		{
			if (modellist[i])
			{
				Models[i]->BuildVertexBuffer();
				precacheProgress.Update();
			}
		}

		precacheProfiler.Unclock();
		DPrintf(DMSG_NOTIFY, TEXTCOLOR_RED "Textures were precached in %.03f ms\n", precacheProfiler.TimeMS());
	}

	delete[] spritehitlist;
	delete[] spritelist;
	delete[] modellist;
}